

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

HashEntry * raviX_hash_table_search_pre_hashed(HashTable *ht,uint32_t hash,void *key)

{
  int iVar1;
  HashEntry *entry_00;
  uint uVar2;
  HashEntry *entry;
  uint local_30;
  uint32_t double_hash;
  uint32_t hash_address;
  uint32_t start_hash_address;
  void *key_local;
  uint32_t hash_local;
  HashTable *ht_local;
  
  uVar2 = hash % ht->size;
  local_30 = uVar2;
  while( true ) {
    entry_00 = ht->table + local_30;
    iVar1 = entry_is_free(entry_00);
    if (iVar1 != 0) {
      return (HashEntry *)0x0;
    }
    iVar1 = entry_is_present(entry_00);
    if (((iVar1 != 0) && (entry_00->hash == hash)) &&
       (iVar1 = (*ht->key_equals_function)(key,entry_00->key), iVar1 != 0)) break;
    local_30 = (local_30 + hash % ht->rehash + 1) % ht->size;
    if (local_30 == uVar2) {
      return (HashEntry *)0x0;
    }
  }
  return entry_00;
}

Assistant:

HashEntry *
raviX_hash_table_search_pre_hashed(HashTable *ht, uint32_t hash,
			     const void *key)
{
	uint32_t start_hash_address = hash % ht->size;
	uint32_t hash_address = start_hash_address;

	do {
		uint32_t double_hash;

		HashEntry *entry = ht->table + hash_address;

		if (entry_is_free(entry)) {
			return NULL;
		} else if (entry_is_present(entry) && entry->hash == hash) {
			if (ht->key_equals_function(key, entry->key)) {
				return entry;
			}
		}

		double_hash = 1 + hash % ht->rehash;

		hash_address = (hash_address + double_hash) % ht->size;
	} while (hash_address != start_hash_address);

	return NULL;
}